

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainCache.cpp
# Opt level: O1

bool parseParameters(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = 1 < argc;
  if (1 < argc) {
    pcVar2 = traceFilePath;
    uVar4 = 2;
    do {
      pcVar3 = argv[uVar4 - 1];
      if (*pcVar3 == '-') {
        pcVar1 = traceFilePath;
        if (pcVar3[1] == 's') {
          isSingleStep = true;
          pcVar3 = pcVar2;
        }
        else {
          if (pcVar3[1] != 'v') goto LAB_00103958;
          verbose = true;
          pcVar3 = pcVar2;
        }
      }
      else {
        pcVar1 = pcVar3;
        if (pcVar2 != (char *)0x0) {
LAB_00103958:
          if (bVar5) {
            return false;
          }
          break;
        }
      }
      traceFilePath = pcVar1;
      bVar5 = uVar4 < (uint)argc;
      bVar6 = uVar4 != (uint)argc;
      pcVar2 = pcVar3;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return traceFilePath != (char *)0x0;
}

Assistant:

bool parseParameters(int argc, char **argv) {
  // Read Parameters
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '-') {
      switch (argv[i][1]) {
      case 'v':
        verbose = 1;
        break;
      case 's':
        isSingleStep = 1;
        break;
      default:
        return false;
      }
    } else {
      if (traceFilePath == nullptr) {
        traceFilePath = argv[i];
      } else {
        return false;
      }
    }
  }
  if (traceFilePath == nullptr) {
    return false;
  }
  return true;
}